

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

OBSOLETE_length_format ON_DimStyle::V6LengthFormat(int v5format)

{
  OBSOLETE_length_format v6format;
  int v5format_local;
  
  if (v5format != 0) {
    if (v5format == 1) {
      return Fractional;
    }
    if (v5format == 2) {
      return FeetInches;
    }
  }
  return Decimal;
}

Assistant:

ON_DimStyle::OBSOLETE_length_format ON_DimStyle::V6LengthFormat(int v5format)
{
  ON_DimStyle::OBSOLETE_length_format v6format = ON_DimStyle::OBSOLETE_length_format::Decimal;
  switch (v5format)
  {
  default:
  case 0:
    v6format = ON_DimStyle::OBSOLETE_length_format::Decimal;
    break;
  case 1:
    v6format = ON_DimStyle::OBSOLETE_length_format::Fractional;
    break;
  case 2:
    v6format = ON_DimStyle::OBSOLETE_length_format::FeetInches;
    break;
  }
  return v6format;
}